

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QSpanCollection::updateSpan(QSpanCollection *this,Span *span,int old_height)

{
  Index *pIVar1;
  int iVar2;
  iterator iVar3;
  const_iterator alast;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  int local_44;
  Span *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = span->m_top;
  iVar5 = span->m_bottom;
  iVar4 = (iVar5 - iVar2) + 1;
  local_40 = span;
  if (old_height < iVar4) {
    pIVar1 = &this->index;
    local_44 = 1 - (iVar2 + old_height);
    iVar3._M_node =
         (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(pIVar1,&local_44);
    if (SBORROW4(local_40->m_bottom,-*(int *)((long)iVar3._M_node + 0x20)) ==
        local_40->m_bottom + *(int *)((long)iVar3._M_node + 0x20) < 0) {
      do {
        local_44 = -local_40->m_left;
        QMap<int,_QSpanCollection::Span_*>::insert
                  ((QMap<int,_QSpanCollection::Span_*> *)&iVar3._M_node[1]._M_parent,&local_44,
                   &local_40);
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(pIVar1);
        if (iVar3._M_node ==
            *(_Base_ptr *)
             ((long)&(((pIVar1->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10))
        break;
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar3._M_node);
      } while (SBORROW4(local_40->m_bottom,-iVar3._M_node[1]._M_color) ==
               (int)(local_40->m_bottom + iVar3._M_node[1]._M_color) < 0);
    }
  }
  else if (iVar4 < old_height) {
    if (iVar2 < iVar5) {
      iVar2 = iVar5;
    }
    pIVar1 = &this->index;
    local_44 = -iVar2;
    iVar3._M_node =
         (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::lowerBound(pIVar1,&local_44);
    iVar2 = -*(int *)((long)iVar3._M_node + 0x20);
    iVar5 = local_40->m_top + old_height;
    if (iVar5 != iVar2 && SBORROW4(iVar5,iVar2) == iVar5 + *(int *)((long)iVar3._M_node + 0x20) < 0)
    {
      do {
        if (local_40->m_bottom < iVar2) {
          local_44 = -local_40->m_left;
          QMap<int,_QSpanCollection::Span_*>::remove
                    ((QMap<int,_QSpanCollection::Span_*> *)&iVar3._M_node[1]._M_parent,
                     (char *)&local_44);
          if ((iVar3._M_node[1]._M_parent == (_Base_ptr)0x0) ||
             (iVar3._M_node[1]._M_parent[1]._M_left == (_Base_ptr)0x0)) {
            alast.i._M_node = (const_iterator)std::_Rb_tree_increment(iVar3._M_node);
            iVar3._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(pIVar1,iVar3._M_node,alast);
          }
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(pIVar1);
        if (iVar3._M_node ==
            *(_Base_ptr *)
             ((long)&(((pIVar1->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10))
        break;
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar3._M_node);
        iVar2 = -iVar3._M_node[1]._M_color;
        iVar5 = local_40->m_top + old_height;
      } while (iVar5 != iVar2 &&
               SBORROW4(iVar5,iVar2) == (int)(iVar5 + iVar3._M_node[1]._M_color) < 0);
    }
  }
  if ((local_40->m_right + 1 == local_40->m_left) && (local_40->m_bottom + 1 == local_40->m_top)) {
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::remove
              (&this->spans,(char *)&local_40);
    operator_delete(local_40,0x14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateSpan(QSpanCollection::Span *span, int old_height)
{
    if (old_height < span->height()) {
        //add the span as subspan in all the lists that intersect the new covered columns
        Index::iterator it_y = index.lowerBound(-(span->top() + old_height - 1));
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->bottom()) {
            (*it_y).insert(-span->left(), span);
            if (it_y == index.begin())
                break;
            --it_y;
        }
    } else if (old_height > span->height()) {
        //remove the span from all the subspans lists that intersect the columns not covered anymore
        Index::iterator it_y = index.lowerBound(-qMax(span->bottom(), span->top())); //qMax useful if height is 0
        Q_ASSERT(it_y != index.end()); //it_y must exist since the span is in the list
        while (-it_y.key() <= span->top() + old_height -1) {
            if (-it_y.key() > span->bottom()) {
                int removed = (*it_y).remove(-span->left());
                Q_ASSERT(removed == 1);
                Q_UNUSED(removed);
                if (it_y->isEmpty()) {
                    it_y = index.erase(it_y);
                }
            }
            if (it_y == index.begin())
                break;
            --it_y;
        }
    }

    if (span->width() == 0 && span->height() == 0) {
        spans.remove(span);
        delete span;
    }
}